

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcgen.cpp
# Opt level: O3

CTcDataStream * CTcDataStream::get_stream_from_id(char stream_id,textchar_t *obj_fname)

{
  CTcDataStream **ppCVar1;
  undefined7 in_register_00000039;
  
  switch((int)CONCAT71(in_register_00000039,stream_id)) {
  case 1:
    ppCVar1 = &G_ds;
    break;
  case 2:
    ppCVar1 = (CTcDataStream **)&G_cs_main;
    break;
  case 3:
    ppCVar1 = &G_os;
    break;
  default:
    CTcMain::log_error(G_tcmain,(CTcTokFileDesc *)0x0,0,TC_SEV_ERROR,0x2e21,obj_fname);
    return (CTcDataStream *)0x0;
  case 6:
    ppCVar1 = &G_bignum_stream;
    break;
  case 8:
    ppCVar1 = &G_icmod_stream;
    break;
  case 9:
    ppCVar1 = (CTcDataStream **)&G_cs_static;
    break;
  case 10:
    ppCVar1 = &G_static_init_id_stream;
    break;
  case 0xb:
    ppCVar1 = &G_lcl_stream;
    break;
  case 0xc:
    ppCVar1 = &G_rexpat_stream;
  }
  return &((CTcCodeStream *)*ppCVar1)->super_CTcDataStream;
}

Assistant:

CTcDataStream *CTcDataStream::
   get_stream_from_id(char stream_id, const textchar_t *obj_fname)
{
    switch(stream_id)
    {
    case TCGEN_DATA_STREAM:
        return G_ds;

    case TCGEN_CODE_STREAM:
        return G_cs_main;

    case TCGEN_STATIC_CODE_STREAM:
        return G_cs_static;

    case TCGEN_OBJECT_STREAM:
        return G_os;

    case TCGEN_ICMOD_STREAM:
        return G_icmod_stream;

    case TCGEN_BIGNUM_STREAM:
        return G_bignum_stream;

    case TCGEN_REXPAT_STREAM:
        return G_rexpat_stream;

    case TCGEN_STATIC_INIT_ID_STREAM:
        return G_static_init_id_stream;

    case TCGEN_LCL_VAR_STREAM:
        return G_lcl_stream;

    default:
        G_tcmain->log_error(0, 0, TC_SEV_ERROR,
                            TCERR_OBJFILE_INVAL_STREAM_ID, obj_fname);
        return 0;
    }
}